

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O3

uchar duckdb::TryCastDecimalCInternal<unsigned_char>(duckdb_result *source,idx_t col,idx_t row)

{
  bool bVar1;
  uchar uVar2;
  undefined8 in_RAX;
  uchar result_value;
  uchar local_1;
  
  local_1 = (uchar)((ulong)in_RAX >> 0x38);
  bVar1 = CastDecimalCInternal<unsigned_char>(source,&local_1,col,row);
  uVar2 = '\0';
  if (bVar1) {
    uVar2 = local_1;
  }
  return uVar2;
}

Assistant:

RESULT_TYPE TryCastDecimalCInternal(duckdb_result *source, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!CastDecimalCInternal<RESULT_TYPE>(source, result_value, col, row)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}